

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAT2FO.cpp
# Opt level: O2

SATClause * __thiscall
SAT::SAT2FO::createConflictClause(SAT2FO *this,LiteralStack *unsatCore,InferenceRule rule)

{
  int iVar1;
  Literal *elem;
  Clause *cl;
  SATClause *pSVar2;
  Literal **ppLVar3;
  NonspecificInference0 local_5a;
  Inference local_58;
  
  if (createConflictClause(Lib::Stack<Kernel::Literal*>&,Kernel::InferenceRule)::negStack == '\0') {
    iVar1 = __cxa_guard_acquire(&createConflictClause(Lib::Stack<Kernel::Literal*>&,Kernel::InferenceRule)
                                 ::negStack);
    if (iVar1 != 0) {
      createConflictClause::negStack._cursor = (Literal **)0x0;
      createConflictClause::negStack._end = (Literal **)0x0;
      createConflictClause::negStack._capacity = 0;
      createConflictClause::negStack._stack = (Literal **)0x0;
      __cxa_atexit(Lib::Stack<Kernel::Literal_*>::~Stack,&createConflictClause::negStack,
                   &__dso_handle);
      __cxa_guard_release(&createConflictClause(Lib::Stack<Kernel::Literal*>&,Kernel::InferenceRule)
                           ::negStack);
    }
  }
  createConflictClause::negStack._cursor = createConflictClause::negStack._stack;
  for (ppLVar3 = unsatCore->_cursor; ppLVar3 != unsatCore->_stack; ppLVar3 = ppLVar3 + -1) {
    elem = Kernel::Literal::complementaryLiteral(ppLVar3[-1]);
    Lib::Stack<Kernel::Literal_*>::push(&createConflictClause::negStack,elem);
  }
  local_5a.inputType = AXIOM;
  local_5a.rule = rule;
  Kernel::Inference::Inference(&local_58,&local_5a);
  cl = Kernel::Clause::fromStack(&createConflictClause::negStack,&local_58);
  pSVar2 = toSAT(this,cl);
  return pSVar2;
}

Assistant:

SATClause* SAT2FO::createConflictClause(LiteralStack& unsatCore, InferenceRule rule)
{
  static LiteralStack negStack;
  negStack.reset();
  LiteralStack::ConstIterator ucit(unsatCore);
  while(ucit.hasNext()) {
    Literal* ul = ucit.next();
    negStack.push(Literal::complementaryLiteral(ul));
  }
  Clause* foConfl = Clause::fromStack(negStack,NonspecificInference0(UnitInputType::AXIOM,rule));
  return toSAT(foConfl);
}